

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpringConstraint::enableSpring
          (btGeneric6DofSpringConstraint *this,int index,bool onOff)

{
  bool onOff_local;
  int index_local;
  btGeneric6DofSpringConstraint *this_local;
  
  *(bool *)((long)this->m_equilibriumPoint + (long)index + -7) = onOff;
  if (index < 3) {
    (this->super_btGeneric6DofConstraint).m_linearLimits.m_enableMotor[index] = onOff;
  }
  else {
    (this->super_btGeneric6DofConstraint).m_angularLimits[index + -3].m_enableMotor = onOff;
  }
  return;
}

Assistant:

void btGeneric6DofSpringConstraint::enableSpring(int index, bool onOff)
{
	btAssert((index >= 0) && (index < 6));
	m_springEnabled[index] = onOff;
	if(index < 3)
	{
		m_linearLimits.m_enableMotor[index] = onOff;
	}
	else
	{
		m_angularLimits[index - 3].m_enableMotor = onOff;
	}
}